

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O1

Token * __thiscall
wabt::WastLexer::GetHexNumberToken
          (Token *__return_storage_ptr__,WastLexer *this,TokenType token_type)

{
  byte *pbVar1;
  byte *pbVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  ReservedChars RVar6;
  long lVar7;
  LiteralType literal_type;
  
  bVar5 = ReadHexNum(this);
  if (!bVar5) goto LAB_00135acf;
  pbVar1 = (byte *)this->buffer_end_;
  pbVar2 = (byte *)this->cursor_;
  if (pbVar2 < pbVar1) {
    bVar5 = *pbVar2 == 0x2e;
  }
  else {
    bVar5 = false;
  }
  if (bVar5 && pbVar2 < pbVar1) {
    this->cursor_ = (char *)(pbVar2 + 1);
  }
  if (bVar5) {
    if (this->cursor_ < pbVar1) {
      lVar7 = (ulong)(byte)*this->cursor_ + 1;
    }
    else {
      lVar7 = 0;
    }
    token_type = First_Literal;
    if (((""[lVar7] & 4U) != 0) && (bVar5 = ReadHexNum(this), !bVar5)) goto LAB_00135acf;
  }
  pcVar3 = this->buffer_end_;
  pcVar4 = this->cursor_;
  if (pcVar4 < pcVar3) {
    bVar5 = *pcVar4 == 'p';
  }
  else {
    bVar5 = false;
  }
  if (bVar5 && pcVar4 < pcVar3) {
    this->cursor_ = pcVar4 + 1;
  }
  if (bVar5) {
LAB_00135a89:
    pcVar4 = this->cursor_;
    bVar5 = true;
    if (pcVar4 < pcVar3) {
      if (*pcVar4 != '+') {
        bVar5 = *pcVar4 != '-';
        goto LAB_00135aa1;
      }
LAB_00135aab:
      this->cursor_ = pcVar4 + 1;
    }
    else {
LAB_00135aa1:
      if (!(bool)(pcVar3 <= pcVar4 | bVar5)) goto LAB_00135aab;
    }
    bVar5 = ReadNum(this);
    token_type = First_Literal;
    if (!bVar5) goto LAB_00135acf;
  }
  else {
    pcVar4 = this->cursor_;
    if (pcVar4 < pcVar3) {
      bVar5 = *pcVar4 == 'P';
    }
    else {
      bVar5 = false;
    }
    if (bVar5 && pcVar4 < pcVar3) {
      this->cursor_ = pcVar4 + 1;
    }
    if (bVar5) goto LAB_00135a89;
  }
  RVar6 = ReadReservedChars(this);
  if (RVar6 == None) {
    if (token_type == First_Literal) {
      token_type = First_Literal;
      literal_type = Hexfloat;
    }
    else {
      literal_type = Int;
    }
    LiteralToken(__return_storage_ptr__,this,token_type,literal_type);
    return __return_storage_ptr__;
  }
LAB_00135acf:
  ReadReservedChars(this);
  TextToken(__return_storage_ptr__,this,Reserved,0);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetHexNumberToken(TokenType token_type) {
  if (ReadHexNum()) {
    if (MatchChar('.')) {
      token_type = TokenType::Float;
      if (IsHexDigit(PeekChar()) && !ReadHexNum()) {
        return GetReservedToken();
      }
    }
    if (MatchChar('p') || MatchChar('P')) {
      token_type = TokenType::Float;
      ReadSign();
      if (!ReadNum()) {
        return GetReservedToken();
      }
    }
    if (NoTrailingReservedChars()) {
      if (token_type == TokenType::Float) {
        return LiteralToken(token_type, LiteralType::Hexfloat);
      } else {
        return LiteralToken(token_type, LiteralType::Int);
      }
    }
  }
  return GetReservedToken();
}